

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

int4 ActionMarkExplicit::multipleInteraction
               (vector<Varnode_*,_std::allocator<Varnode_*>_> *multlist)

{
  OpCode OVar1;
  pointer ppVVar2;
  PcodeOp *pPVar3;
  Varnode *this;
  ulong uVar4;
  ulong uVar5;
  int4 i;
  ulong uVar6;
  int4 i_1;
  long lVar7;
  Varnode *topvn;
  vector<Varnode_*,_std::allocator<Varnode_*>_> purgelist;
  
  purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  do {
    ppVVar2 = (multlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(multlist->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppVVar2 >> 3) <= uVar6) {
      for (uVar6 = 0;
          uVar4 = (long)purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3, uVar6 < uVar4; uVar6 = uVar6 + 1) {
        this = purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
        Varnode::setExplicit(this);
        Varnode::clearImplied(this);
        *(byte *)&this->flags = (byte)this->flags & 0xfe;
      }
      std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
                (&purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>);
      return (int4)uVar4;
    }
    pPVar3 = ppVVar2[uVar6]->def;
    OVar1 = pPVar3->opcode->opcode;
    if (((pPVar3->flags & 0x80) != 0) ||
       ((OVar1 - CPUI_INT_ZEXT < 0x31 &&
        ((0x1000000000003U >> ((ulong)(OVar1 - CPUI_INT_ZEXT) & 0x3f) & 1) != 0)))) {
      uVar4 = (ulong)((long)*(pointer *)
                             ((long)&(pPVar3->inrefs).
                                     super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                     _M_impl + 8) -
                     *(long *)&(pPVar3->inrefs).
                               super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                               super__Vector_impl_data) >> 3;
      if (1 < (int)uVar4) {
        uVar4 = 2;
      }
      uVar5 = uVar4 & 0xffffffff;
      topvn = (Varnode *)0x0;
      if ((int)uVar4 < 1) {
        uVar5 = 0;
      }
      for (lVar7 = 0; uVar5 * 8 != lVar7; lVar7 = lVar7 + 8) {
        topvn = *(Varnode **)
                 (*(long *)&(pPVar3->inrefs).
                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                            super__Vector_impl_data + lVar7);
        if ((topvn->flags & 1) != 0) {
          if ((topvn->flags & 0x10) == 0) {
            if (OVar1 != CPUI_PTRADD) {
LAB_0030f40a:
              std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back(&purgelist,&topvn);
            }
          }
          else if (((topvn->def->flags & 0x80) == 0) &&
                  ((OVar1 != CPUI_PTRADD || (topvn->def->opcode->opcode == CPUI_PTRADD))))
          goto LAB_0030f40a;
        }
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int4 ActionMarkExplicit::multipleInteraction(vector<Varnode *> &multlist)

{
  vector<Varnode *> purgelist;

  for(int4 i=0;i<multlist.size();++i) {
    Varnode *vn = multlist[i];	// All elements in this list should have a defining op
    PcodeOp *op = vn->getDef();
    OpCode opc = op->code();
    if (op->isBoolOutput() || (opc == CPUI_INT_ZEXT) || (opc == CPUI_INT_SEXT) || (opc == CPUI_PTRADD)) {
      int4 maxparam = 2;
      if (op->numInput() < maxparam)
	maxparam = op->numInput();
      Varnode *topvn = (Varnode *)0;
      for(int4 j=0;j<maxparam;++j) {
	topvn = op->getIn(j);
	if (topvn->isMark()) {	// We have a "multiple" interaction between -topvn- and -vn-
	  OpCode topopc = CPUI_COPY;
	  if (topvn->isWritten()) {
	    if (topvn->getDef()->isBoolOutput())
	      continue;		// Try not to make boolean outputs explicit
	    topopc = topvn->getDef()->code();
	  }
	  if (opc == CPUI_PTRADD) {
	    if (topopc == CPUI_PTRADD)
	      purgelist.push_back(topvn);
	  }
	  else
	    purgelist.push_back(topvn);
	}
      }
    }
  }

  for(int4 i=0;i<purgelist.size();++i) {
    Varnode *vn = purgelist[i];
    vn->setExplicit();
    vn->clearImplied();
    vn->clearMark();
  }
  return purgelist.size();
}